

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Material *material,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar3;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t n_01;
  uint32_t extraout_EDX_05;
  uint32_t n_02;
  uint32_t extraout_EDX_06;
  uint32_t n_03;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  Path *p;
  Path *extraout_RDX;
  Path *extraout_RDX_00;
  Path *extraout_RDX_01;
  Path *extraout_RDX_02;
  Path *p_00;
  Path *extraout_RDX_03;
  Path *extraout_RDX_04;
  Path *extraout_RDX_05;
  Path *extraout_RDX_06;
  Path *p_01;
  Path *extraout_RDX_07;
  Path *extraout_RDX_08;
  Path *extraout_RDX_09;
  Path *extraout_RDX_10;
  Path *pPVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  stringstream ss;
  string local_218;
  uint local_1f4;
  ulong local_1f0;
  string *local_1e8;
  uint32_t local_1dc;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar7 = (ulong)material & 0xffffffff;
  local_1dc = indent;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)material & 0xffffffff),n);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0x20),s);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Material \"",0xb);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)this,*(long *)(this + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  bVar1 = PrimMetas::authored((PrimMetas *)(this + 0x30));
  uVar3 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)material & 0xffffffff),n_00);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    print_prim_metas_abi_cxx11_
              (&local_218,this + 0x30,(PrimMeta *)(ulong)((int)material + 1),indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    uVar3 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      uVar3 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)material & 0xffffffff),uVar3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    uVar3 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      uVar3 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)material & 0xffffffff),uVar3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  uVar3 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    uVar3 = extraout_EDX_04;
  }
  if (this[0x748] == (tinyusdz)0x1) {
    local_1f4 = (int)material + 1;
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)local_1f4,uVar3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"token outputs:surface.connect ",0x1e)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(this + 0x738) - *(long *)(this + 0x730) == 0xd0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= ",2);
      (anonymous_namespace)::pquote_abi_cxx11_
                (&local_218,*(_anonymous_namespace_ **)(this + 0x730),p);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    else if (1 < (ulong)((*(long *)(this + 0x738) - *(long *)(this + 0x730) >> 4) *
                        0x4ec4ec4ec4ec4ec5)) {
      local_1f0 = uVar7;
      local_1e8 = __return_storage_ptr__;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= [",3);
      lVar6 = *(long *)(this + 0x730);
      if (*(long *)(this + 0x738) != lVar6) {
        lVar5 = 0;
        uVar7 = 0;
        pPVar4 = extraout_RDX;
        do {
          (anonymous_namespace)::pquote_abi_cxx11_
                    (&local_218,(_anonymous_namespace_ *)(lVar6 + lVar5),pPVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
          pPVar4 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
            pPVar4 = extraout_RDX_01;
          }
          if (uVar7 != (*(long *)(this + 0x738) - *(long *)(this + 0x730) >> 4) * 0x4ec4ec4ec4ec4ec5
                       - 1U) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
            pPVar4 = extraout_RDX_02;
          }
          uVar7 = uVar7 + 1;
          lVar6 = *(long *)(this + 0x730);
          lVar5 = lVar5 + 0xd0;
        } while (uVar7 < (ulong)((*(long *)(this + 0x738) - lVar6 >> 4) * 0x4ec4ec4ec4ec4ec5));
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      uVar7 = local_1f0;
      __return_storage_ptr__ = local_1e8;
    }
    bVar1 = AttrMetas::authored((AttrMetas *)(this + 0x750));
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      print_attr_metas_abi_cxx11_
                (&local_218,this + 0x750,(AttrMeta *)(ulong)((int)uVar7 + 2),indent);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)local_1f4,n_01);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    uVar3 = extraout_EDX_05;
  }
  if (this[0x978] == (tinyusdz)0x1) {
    local_1f4 = (int)uVar7 + 1;
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)local_1f4,uVar3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"token outputs:displacement.connect ",0x23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(this + 0x968) - *(long *)(this + 0x960) == 0xd0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= ",2);
      (anonymous_namespace)::pquote_abi_cxx11_
                (&local_218,*(_anonymous_namespace_ **)(this + 0x960),p_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    else if (1 < (ulong)((*(long *)(this + 0x968) - *(long *)(this + 0x960) >> 4) *
                        0x4ec4ec4ec4ec4ec5)) {
      local_1f0 = uVar7;
      local_1e8 = __return_storage_ptr__;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= [",3);
      lVar6 = *(long *)(this + 0x960);
      if (*(long *)(this + 0x968) != lVar6) {
        lVar5 = 0;
        uVar7 = 0;
        pPVar4 = extraout_RDX_03;
        do {
          (anonymous_namespace)::pquote_abi_cxx11_
                    (&local_218,(_anonymous_namespace_ *)(lVar6 + lVar5),pPVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
          pPVar4 = extraout_RDX_04;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
            pPVar4 = extraout_RDX_05;
          }
          if (uVar7 != (*(long *)(this + 0x968) - *(long *)(this + 0x960) >> 4) * 0x4ec4ec4ec4ec4ec5
                       - 1U) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
            pPVar4 = extraout_RDX_06;
          }
          uVar7 = uVar7 + 1;
          lVar6 = *(long *)(this + 0x960);
          lVar5 = lVar5 + 0xd0;
        } while (uVar7 < (ulong)((*(long *)(this + 0x968) - lVar6 >> 4) * 0x4ec4ec4ec4ec4ec5));
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      uVar7 = local_1f0;
      __return_storage_ptr__ = local_1e8;
    }
    bVar1 = AttrMetas::authored((AttrMetas *)(this + 0x980));
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      print_attr_metas_abi_cxx11_
                (&local_218,this + 0x980,(AttrMeta *)(ulong)((int)uVar7 + 2),indent);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)local_1f4,n_02);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    uVar3 = extraout_EDX_06;
  }
  if (this[0xba8] == (tinyusdz)0x1) {
    local_1f4 = (int)uVar7 + 1;
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)local_1f4,uVar3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"token outputs:volume.connect ",0x1d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(this + 0xb98) - *(long *)(this + 0xb90) == 0xd0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= ",2);
      (anonymous_namespace)::pquote_abi_cxx11_
                (&local_218,*(_anonymous_namespace_ **)(this + 0xb90),p_01);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    else if (1 < (ulong)((*(long *)(this + 0xb98) - *(long *)(this + 0xb90) >> 4) *
                        0x4ec4ec4ec4ec4ec5)) {
      local_1f0 = uVar7;
      local_1e8 = __return_storage_ptr__;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= [",3);
      lVar6 = *(long *)(this + 0xb90);
      if (*(long *)(this + 0xb98) != lVar6) {
        lVar5 = 0;
        uVar7 = 0;
        pPVar4 = extraout_RDX_07;
        do {
          (anonymous_namespace)::pquote_abi_cxx11_
                    (&local_218,(_anonymous_namespace_ *)(lVar6 + lVar5),pPVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
          pPVar4 = extraout_RDX_08;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
            pPVar4 = extraout_RDX_09;
          }
          if (uVar7 != (*(long *)(this + 0xb98) - *(long *)(this + 0xb90) >> 4) * 0x4ec4ec4ec4ec4ec5
                       - 1U) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
            pPVar4 = extraout_RDX_10;
          }
          uVar7 = uVar7 + 1;
          lVar6 = *(long *)(this + 0xb90);
          lVar5 = lVar5 + 0xd0;
        } while (uVar7 < (ulong)((*(long *)(this + 0xb98) - lVar6 >> 4) * 0x4ec4ec4ec4ec4ec5));
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      uVar7 = local_1f0;
      __return_storage_ptr__ = local_1e8;
    }
    bVar1 = AttrMetas::authored((AttrMetas *)(this + 0xbb0));
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      print_attr_metas_abi_cxx11_
                (&local_218,this + 0xbb0,(AttrMeta *)(ulong)((int)uVar7 + 2),indent);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)local_1f4,n_03);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  print_props(&local_218,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x6d0),(int)uVar7 + 1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  uVar3 = extraout_EDX_07;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    uVar3 = extraout_EDX_08;
  }
  if ((char)local_1dc != '\0') {
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)(uVar7 & 0xffffffff),uVar3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Material &material, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(material.spec) << " Material \""
     << material.name << "\"\n";
  if (material.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(material.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  if (material.surface.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:surface.connect ";

    const auto &conns = material.surface.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.surface.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.surface.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  if (material.displacement.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:displacement.connect ";

    const auto &conns = material.displacement.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.displacement.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.displacement.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  if (material.volume.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:volume.connect ";

    const auto &conns = material.volume.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.volume.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.volume.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  ss << print_props(material.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}